

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  byte bVar2;
  time_t tVar3;
  __int32_t **pp_Var4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char input [1024];
  
  pcVar5 = input;
  pcVar6 = input;
  pcVar7 = input;
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  puts("Please enter a string, consisting only of alphanumeric characters and spaces:");
  printf("> ");
  fgets(input,0x400,_stdin);
  do {
    cVar1 = *pcVar5;
    if (cVar1 == '\0') {
LAB_0010121e:
      putchar(10);
      puts("The encoded version is as follows:");
      for (; *pcVar6 != '\0'; pcVar6 = pcVar6 + 1) {
        bVar2 = encode(*pcVar6);
        putchar((uint)bVar2);
      }
      puts("\n");
      puts("The decoded version is as follows:");
      for (; *pcVar7 != '\0'; pcVar7 = pcVar7 + 1) {
        bVar2 = decode(*pcVar7);
        putchar((uint)bVar2);
      }
      putchar(10);
      return 0;
    }
    if (cVar1 == '\n') {
      *pcVar5 = '\0';
      goto LAB_0010121e;
    }
    pp_Var4 = __ctype_toupper_loc();
    *pcVar5 = (char)(*pp_Var4)[cVar1];
    pcVar5 = pcVar5 + 1;
  } while( true );
}

Assistant:

int main(int argc, char* argv[]) {
  bool is_valid = false;
  char input[1024];

  srand((unsigned int)time(0));

  do {
    printf("Please enter a string, consisting only of alphanumeric characters and spaces:\n");
    printf("> ");

    fgets(input, sizeof input, stdin);

    is_valid = true;
    size_t n = 0;
    for (; input[n] != '\n' && input[n] != 0; n++) {
      input[n] = (char)toupper(input[n]);
      if (!( // <- notice the !
          (input[n] >= 'A' && input[n] <= 'Z')
          || (input[n] >= '0' && input[n] <= '9')
          || input[n] != ' '
          || input[n] != '-')
        ) {
        is_valid = false;
        break;
      }
    }
    if (input[n] == '\n') input[n] = 0;
  } while (!is_valid);

  printf("\n");

  printf("The encoded version is as follows:\n");
  for (size_t n = 0; input[n]; n++) {
    printf("%c", encode(input[n]));
  }
  printf("\n\n");

  printf("The decoded version is as follows:\n");
  for (size_t n = 0; input[n]; n++) {
    printf("%c", decode(input[n]));
  }
  printf("\n");

  return 0;
}